

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module_host.hpp
# Opt level: O1

Map * __thiscall
chains::
ModuleHost<chains::phasor::Module,std::tuple<chains::Parameter<chains::phasor::Frequency>>,chains::Expose<chains::phasor::Frequency>>
::makeInputMap<std::tuple,chains::Parameter<chains::phasor::Frequency>>
          (Map *__return_storage_ptr__,void *this,
          tuple<chains::Parameter<chains::phasor::Frequency>_> *parameters)

{
  undefined8 local_60;
  undefined8 uStack_58;
  code *local_50;
  undefined8 uStack_48;
  double local_40 [3];
  code *local_28;
  undefined8 local_20;
  
  local_40[0] = (parameters->super__Tuple_impl<0UL,_chains::Parameter<chains::phasor::Frequency>_>).
                super__Head_base<0UL,_chains::Parameter<chains::phasor::Frequency>,_false>.
                _M_head_impl.defaultValue_;
  local_60 = 0;
  uStack_58 = 0;
  local_20 = 0;
  local_28 = (code *)0x0;
  local_40[2] = 0.0;
  local_40[1] = 0.0;
  uStack_48 = 0;
  local_50 = (code *)0x0;
  boost::hana::make_impl<boost::hana::map_tag,void>::
  apply<boost::hana::pair<boost::hana::type_impl<chains::phasor::Frequency>::_,chains::CallbackInput>>
            (__return_storage_ptr__,(make_impl<boost::hana::map_tag,void> *)local_40,
             (pair<boost::hana::type_impl<chains::phasor::Frequency>::_,_chains::CallbackInput> *)
             parameters);
  if (local_28 != (code *)0x0) {
    (*local_28)(local_40 + 1,local_40 + 1,3);
  }
  if (local_50 != (code *)0x0) {
    (*local_50)(&local_60,&local_60,3);
  }
  return __return_storage_ptr__;
}

Assistant:

auto makeInputMap(const Tuple<Parameter...>& parameters) const
  {
    using namespace boost::hana;
    return make_map(make_pair(
      type_c<typename Parameter::Traits>,
      std::get<Parameter>(parameters)
        .template makeInput<typeIsInPack<typename Parameter::Traits, Exposed...>>())...);
  }